

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.c
# Opt level: O1

Bigint * multadd(Bigint *b,int m,int a)

{
  int iVar1;
  Bigint *pBVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  
  iVar1 = b->wds;
  uVar6 = (ulong)a;
  iVar3 = 1;
  if (1 < iVar1) {
    iVar3 = iVar1;
  }
  lVar4 = 0;
  do {
    uVar5 = (ulong)b->x[lVar4] * (long)m + uVar6;
    uVar6 = uVar5 >> 0x20;
    b->x[lVar4] = (ULong)uVar5;
    lVar4 = lVar4 + 1;
  } while (iVar3 != (int)lVar4);
  if (uVar5 >> 0x20 != 0) {
    pBVar2 = b;
    if (b->maxwds <= iVar1) {
      pBVar2 = Balloc(b->k + 1);
      memcpy(&pBVar2->sign,&b->sign,(long)b->wds * 4 + 8);
      if (b != (Bigint *)0x0) {
        lVar4 = (long)b->k;
        if (lVar4 < 8) {
          b->next = TI0.Freelist[lVar4];
          TI0.Freelist[lVar4] = b;
        }
        else {
          free(b);
        }
      }
    }
    b = pBVar2;
    b->x[iVar1] = (ULong)(uVar5 >> 0x20);
    b->wds = iVar1 + 1;
  }
  return b;
}

Assistant:

static Bigint *
multadd(Bigint *b, int m, int a MTd)	/* multiply by m and add a */
{
	int i, wds;
#ifdef ULLong
	ULong *x;
	ULLong carry, y;
#else
	ULong carry, *x, y;
#ifdef Pack_32
	ULong xi, z;
#endif
#endif
	Bigint *b1;

	wds = b->wds;
	x = b->x;
	i = 0;
	carry = a;
	do {
#ifdef ULLong
		y = *x * (ULLong)m + carry;
		carry = y >> 32;
		*x++ = y & FFFFFFFF;
#else
#ifdef Pack_32
		xi = *x;
		y = (xi & 0xffff) * m + carry;
		z = (xi >> 16) * m + (y >> 16);
		carry = z >> 16;
		*x++ = (z << 16) + (y & 0xffff);
#else
		y = *x * m + carry;
		carry = y >> 16;
		*x++ = y & 0xffff;
#endif
#endif
		}
		while(++i < wds);
	if (carry) {
		if (wds >= b->maxwds) {
			b1 = Balloc(b->k+1 MTa);
			Bcopy(b1, b);
			Bfree(b MTa);
			b = b1;
			}
		b->x[wds++] = carry;
		b->wds = wds;
		}
	return b;
	}